

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.cpp
# Opt level: O0

double despot::Gamma::Next(double k,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double v_1;
  double u_1;
  double r;
  double z_1;
  double y;
  double x_1;
  double e_1;
  double d_1;
  double c_1;
  double b;
  double v;
  double u;
  double x;
  double e;
  double z;
  double d;
  double c;
  double theta_local;
  double k_local;
  
  if (1.0 <= k) {
    dVar1 = log(4.0);
    dVar2 = sqrt(k + k + -1.0);
    dVar3 = sqrt(k + k + -1.0);
    dVar5 = log(4.5);
    do {
      dVar6 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar7 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar8 = log(dVar7 / (1.0 - dVar7));
      dVar4 = exp(dVar8 / dVar3);
      dVar4 = k * dVar4;
      dVar7 = dVar6 * dVar7 * dVar7;
      dVar6 = ((k + dVar2) * (dVar8 / dVar3) + (k - dVar1)) - dVar4;
      if (dVar7 * 4.5 + -(dVar5 + 1.0) <= dVar6) break;
      dVar8 = log(dVar7);
    } while (dVar6 < dVar8);
  }
  else {
    dVar1 = pow(k,k / (1.0 - k));
    do {
      dVar2 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar3 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar2 = log(dVar2);
      dVar3 = log(dVar3);
      dVar4 = pow(-dVar2,1.0 / k);
    } while (-dVar2 + -dVar3 < (1.0 - k) * dVar1 + dVar4);
  }
  k_local = dVar4 * theta;
  return k_local;
}

Assistant:

double Gamma::Next(double k, double theta) {
	if (k < 1) {
		double c = 1 / k;
		double d = (1 - k) * pow(k, k / (1 - k));
		double z, e, x;
		while (true) { //Weibull's algorithm
			double u = Random::RANDOM.NextDouble();
			double v = Random::RANDOM.NextDouble();
			z = -log(u);
			e = -log(v);
			x = pow(z, c);
			if (z + e >= d + x)
				return x * theta;
		}
	} else { // Cheng's algorithm
		double b = k - log(4);
		double c = k + sqrt(2 * k - 1);
		double d = sqrt(2 * k - 1);
		double e = 1 + log(4.5);
		double x, y, z, r;
		while (true) {
			double u = Random::RANDOM.NextDouble();
			double v = Random::RANDOM.NextDouble();
			y = log(v / (1 - v)) / d;
			x = k * exp(y);
			z = u * v * v;
			r = b + c * y - x;
			if (r >= 4.5 * z - e || r >= log(z))
				return x * theta;
		}
	}
}